

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadHalfArray
          (CrateReader *this,bool is_compressed,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *d)

{
  void *__buf;
  bool bVar1;
  half hVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  ssize_t sVar6;
  pointer phVar7;
  _Alloc_hider _Var8;
  size_t i;
  pointer phVar9;
  int iVar10;
  char *pcVar11;
  size_t sz;
  uint32_t n;
  size_t length;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t shapesize;
  ostringstream ss_e;
  uint local_1f4;
  pointer local_1f0;
  string local_1e8;
  string local_1c8;
  _Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> local_1a8 [16];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar1 = StreamReader::read4(this->_sr,(uint32_t *)&local_1c8);
    if (bVar1) {
      bVar1 = StreamReader::read4(this->_sr,&local_1f4);
      if (bVar1) {
        phVar7 = (pointer)(ulong)local_1f4;
        goto LAB_001756cf;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadHalfArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      iVar10 = 0x1ac;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadHalfArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      iVar10 = 0x1a7;
    }
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,iVar10);
    ::std::operator<<(poVar3," ");
    pcVar11 = "Failed to read the number of array elements.";
  }
  else {
    bVar1 = StreamReader::read8(this->_sr,(uint64_t *)local_1a8);
    phVar7 = local_1a8[0]._M_impl.super__Vector_impl_data._M_start;
    if (!bVar1) goto LAB_001757cf;
LAB_001756cf:
    local_1f0 = phVar7;
    if ((pointer)(this->_config).maxArrayElements < phVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadHalfArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1ba);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"Too many array elements {}.",(allocator *)&local_1f4);
      fmt::format<unsigned_long>(&local_1e8,&local_1c8,(unsigned_long *)&local_1f0);
      poVar3 = ::std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00175993;
    }
    __buf = (void *)((long)phVar7 * 2);
    uVar4 = this->_memoryUsage + (long)__buf;
    this->_memoryUsage = uVar4;
    if (uVar4 <= (this->_config).maxMemoryBudget) {
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                (d,(size_type)phVar7);
      if (is_compressed) {
        if ((pointer)0xf < phVar7) {
          bVar1 = StreamReader::read1(this->_sr,(char *)&local_1f4);
          if (bVar1) {
            if (local_1f4._0_1_ == (allocator)0x74) {
              bVar1 = StreamReader::read4(this->_sr,(uint32_t *)&local_1c8);
              if (bVar1) {
                local_1a8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1a8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1a8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                          ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                           local_1a8,(ulong)(uint)local_1c8._M_dataplus._M_p);
                sVar6 = StreamReader::read(this->_sr,
                                           (int)(void *)((ulong)(uint)local_1c8._M_dataplus._M_p * 2
                                                        ),
                                           (void *)((ulong)(uint)local_1c8._M_dataplus._M_p * 2),
                                           (size_t)local_1a8[0]._M_impl.super__Vector_impl_data.
                                                   _M_start);
                if (sVar6 == 0) {
                  ::std::__cxx11::string::append((char *)&this->_err);
                  ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                  ::~_Vector_base(local_1a8);
                  return false;
                }
                local_1e8._M_dataplus._M_p = (pointer)0x0;
                local_1e8._M_string_length = 0;
                local_1e8.field_2._M_allocated_capacity = 0;
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8,
                           (size_type)phVar7);
                bVar1 = ReadCompressedInts<unsigned_int>
                                  (this,(uint *)local_1e8._M_dataplus._M_p,
                                   (long)(local_1e8._M_string_length -
                                         (long)local_1e8._M_dataplus._M_p) >> 2);
                if (bVar1) {
                  phVar7 = (d->
                           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  for (_Var8._M_p = local_1e8._M_dataplus._M_p;
                      _Var8._M_p != (pointer)local_1e8._M_string_length; _Var8._M_p = _Var8._M_p + 4
                      ) {
                    phVar7->value =
                         local_1a8[0]._M_impl.super__Vector_impl_data._M_start[*(uint *)_Var8._M_p].
                         value;
                    phVar7 = phVar7 + 1;
                  }
                }
                else {
                  ::std::__cxx11::string::append((char *)&this->_err);
                }
                ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8);
                ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                ~_Vector_base(local_1a8);
                goto LAB_00175c58;
              }
            }
            else if (local_1f4._0_1_ == (allocator)0x69) {
              local_1a8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1a8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)local_1a8,(size_type)phVar7);
              bVar1 = ReadCompressedInts<int>
                                (this,(int *)local_1a8[0]._M_impl.super__Vector_impl_data._M_start,
                                 (long)local_1a8[0]._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1a8[0]._M_impl.super__Vector_impl_data._M_start >> 2);
              if (bVar1) {
                for (phVar9 = (pointer)0x0; phVar9 < phVar7;
                    phVar9 = (pointer)((long)&phVar9->value + 1)) {
                  hVar2 = tinyusdz::value::float_to_half_full
                                    ((float)*(int *)(local_1a8[0]._M_impl.super__Vector_impl_data.
                                                     _M_start + (long)phVar9 * 2));
                  (d->
                  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)
                  ._M_impl.super__Vector_impl_data._M_start[(long)phVar9].value = hVar2.value;
                }
              }
              else {
                ::std::__cxx11::string::append((char *)&this->_err);
              }
              ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)local_1a8);
LAB_00175c58:
              if (bVar1 == false) {
                return false;
              }
              return true;
            }
          }
          goto LAB_001757cf;
        }
        lVar5 = StreamReader::read(this->_sr,(int)__buf,__buf,
                                   (size_t)(d->
                                           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        lVar5 = StreamReader::read(this->_sr,(int)__buf,__buf,
                                   (size_t)(d->
                                           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
      }
      if (lVar5 != 0) {
        return true;
      }
LAB_001757cf:
      ::std::__cxx11::string::append((char *)&this->_err);
      return false;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadHalfArray");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1bd);
    ::std::operator<<(poVar3," ");
    pcVar11 = "Reached to max memory budget.";
  }
  poVar3 = ::std::operator<<((ostream *)local_1a8,pcVar11);
  ::std::operator<<(poVar3,"\n");
LAB_00175993:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return false;
}

Assistant:

bool CrateReader::ReadHalfArray(bool is_compressed,
                                std::vector<value::half> *d) {
  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many array elements {}.", length));
  }

  CHECK_MEMORY_USAGE(length * sizeof(uint16_t));

  d->resize(length);

  if (!is_compressed) {


    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(uint16_t) * length, sizeof(uint16_t) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read half array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(uint16_t) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadHalfArray.\n";
        return false;
      }
      for (size_t i = 0; i < length; i++) {
        float f = float(ints[i]);
        value::half h = value::float_to_half_full(f);
        (*d)[i] = h;
      }
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadHalfArray.\n";
        return false;
      }

      std::vector<value::half> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(value::half) * lutSize, sizeof(value::half) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadHalfArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadHalfArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}